

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O1

void sptk::world::interp1(double *x,double *y,int x_length,double *xi,int xi_length,double *yi)

{
  void *pvVar1;
  int *index;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (long)(int)(x_length - 1U) << 3;
  if (x_length < 1) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar1 = operator_new__(uVar3);
  uVar3 = (long)xi_length * 4;
  if (xi_length < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  index = (int *)operator_new__(uVar3);
  if (1 < x_length) {
    uVar3 = 0;
    do {
      *(double *)((long)pvVar1 + uVar3 * 8) = x[uVar3 + 1] - x[uVar3];
      uVar3 = uVar3 + 1;
    } while (x_length - 1U != uVar3);
  }
  if (0 < xi_length) {
    memset(index,0,(ulong)(uint)xi_length * 4);
  }
  histc(x,x_length,xi,xi_length,index);
  if (0 < xi_length) {
    uVar3 = 0;
    do {
      lVar2 = (long)index[uVar3];
      yi[uVar3] = (y[lVar2] - y[lVar2 + -1]) *
                  ((xi[uVar3] - x[lVar2 + -1]) / *(double *)((long)pvVar1 + lVar2 * 8 + -8)) +
                  y[lVar2 + -1];
      uVar3 = uVar3 + 1;
    } while ((uint)xi_length != uVar3);
  }
  operator_delete__(index);
  operator_delete__(pvVar1);
  return;
}

Assistant:

void interp1(const double *x, const double *y, int x_length, const double *xi,
    int xi_length, double *yi) {
  double *h = new double[x_length - 1];
  int *k = new int[xi_length];

  for (int i = 0; i < x_length - 1; ++i) h[i] = x[i + 1] - x[i];
  for (int i = 0; i < xi_length; ++i) {
    k[i] = 0;
  }

  histc(x, x_length, xi, xi_length, k);

  for (int i = 0; i < xi_length; ++i) {
    double s = (xi[i] - x[k[i] - 1]) / h[k[i] - 1];
    yi[i] = y[k[i] - 1] + s * (y[k[i]] - y[k[i] - 1]);
  }

  delete[] k;
  delete[] h;
}